

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

char * ox_stack_popfront(stack_s *self)

{
  char *pcVar1;
  char *ret;
  stack_s *self_local;
  
  pcVar1 = ox_stack_front(self);
  if (pcVar1 != (char *)0x0) {
    self->num = self->num + -1;
    self->front = self->front + 1;
    self->front = self->front % self->element_num;
  }
  return pcVar1;
}

Assistant:

char*
ox_stack_popfront(struct stack_s* self)
{
    char* ret = ox_stack_front(self);

    if(ret != NULL)
    {
        self->num--;
        self->front++;
        self->front %= self->element_num;
    }

    return ret;
}